

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

void btokSMStart(void *state,octet *key)

{
  void *in_RSI;
  octet *in_RDI;
  btok_sm_st *st;
  octet *key_00;
  
  key_00 = in_RDI;
  memSet(in_RSI,(octet)((ulong)in_RDI >> 0x38),0x17322b);
  beltKRPStart(st,key_00,(size_t)in_RSI,in_RDI);
  in_RDI[0x40] = '\x01';
  beltKRPStepG((octet *)state,(size_t)key,st->key1,key_00);
  in_RDI[0x40] = '\x02';
  beltKRPStepG((octet *)state,(size_t)key,st->key1,key_00);
  in_RDI[0x40] = '\0';
  return;
}

Assistant:

void btokSMStart(void* state, const octet key[32])
{
	btok_sm_st* st = (btok_sm_st*)state;
	// pre
	ASSERT(memIsDisjoint2(key, 32, state, btokSM_keep()));
	// key_i <- belt-keyrep(key, 0, <i>, 32);
	memSetZero(st->ctr, 16);
	beltKRPStart(st->stack, key, 32, st->ctr);
	st->ctr[0] = 1;
	beltKRPStepG(st->key1, 32, st->ctr, st->stack);
	st->ctr[0] = 2;
	beltKRPStepG(st->key2, 32, st->ctr, st->stack);
	// ctr <- 0
	st->ctr[0] = 0;
}